

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O3

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this_00;
  int *piVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int in_EDX;
  int __c;
  int __c_00;
  DataKey *k;
  Name nam;
  char *local_28;
  
  this_00 = &this->hashtab;
  local_28 = __filename;
  pcVar4 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                     (this_00,(char *)&local_28,in_EDX);
  iVar3 = (int)pcVar4;
  if (-1 < iVar3) {
    pcVar4 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                       (this_00,(char *)&local_28,__c);
    k = (DataKey *)0x0;
    if (-1 < (int)pcVar4) {
      k = (DataKey *)
          ((long)((this_00->m_elem).data.
                  super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + ((ulong)pcVar4 & 0xffffffff)) + 8);
    }
    pcVar4 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                       (this_00,(char *)&local_28,__c_00);
    if (-1 < (int)pcVar4) {
      *(states *)
       ((long)((this->hashtab).m_elem.data.
               super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
               ._M_impl.super__Vector_impl_data._M_start + ((ulong)pcVar4 & 0xffffffff)) + 0x10) =
           RELEASED;
      piVar1 = &(this->hashtab).m_used;
      *piVar1 = *piVar1 + -1;
    }
    uVar2 = DataSet<int>::number(&this->set,k);
    iVar3 = DataSet<int>::remove(&this->set,(char *)(ulong)uVar2);
  }
  return iVar3;
}

Assistant:

void NameSet::remove(const char* str)
{
   const Name nam(str);

   if(hashtab.has(nam))
   {
      const DataKey* hkey = hashtab.get(nam);
      assert(hkey != nullptr);
      hashtab.remove(nam);
      set.remove(*hkey);
   }
}